

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O0

void __thiscall CLParserTestParseSimple::~CLParserTestParseSimple(CLParserTestParseSimple *this)

{
  CLParserTestParseSimple *this_local;
  
  ~CLParserTestParseSimple(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CLParserTest, ParseSimple) {
  CLParser parser;
  string output, err;
  ASSERT_TRUE(parser.Parse(
      "foo\r\n"
      "Note: inc file prefix:  foo.h\r\n"
      "bar\r\n",
      "Note: inc file prefix:", &output, &err));

  ASSERT_EQ("foo\nbar\n", output);
  ASSERT_EQ(1u, parser.includes_.size());
  ASSERT_EQ("foo.h", *parser.includes_.begin());
}